

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBString::CBString(CBString *this,char c,int len)

{
  uchar *puVar1;
  CBStringException *this_00;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  CBStringException bstr__cppwrapper_exception;
  int len_local;
  char c_local;
  CBString *this_local;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_0026f840;
  (this->super_tagbstring).data = (uchar *)0x0;
  bstr__cppwrapper_exception.msg.field_2._8_4_ = len;
  bstr__cppwrapper_exception.msg.field_2._M_local_buf[0xf] = c;
  if (-1 < len) {
    (this->super_tagbstring).mlen = len + 1;
    (this->super_tagbstring).slen = len;
    puVar1 = (uchar *)malloc((long)(this->super_tagbstring).mlen);
    (this->super_tagbstring).data = puVar1;
  }
  if ((this->super_tagbstring).data == (uchar *)0x0) {
    (this->super_tagbstring).slen = 0;
    (this->super_tagbstring).mlen = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_60,"CBString::Failure in repeat(char) constructor",&local_61);
    CBStringException::CBStringException((CBStringException *)local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_40);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if (0 < (this->super_tagbstring).slen) {
    memset((this->super_tagbstring).data,
           (uint)(byte)bstr__cppwrapper_exception.msg.field_2._M_local_buf[0xf],
           (long)(this->super_tagbstring).slen);
  }
  (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
  return;
}

Assistant:

CBString::CBString (char c, int len) {
	data = NULL;
	if (len >= 0) {
		mlen = len + 1;
		slen = len;
		data = (unsigned char *) bstr__alloc (mlen);
	}
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in repeat(char) constructor");
	} else {
		if (slen > 0) bstr__memset (data, c, slen);
		data[slen] = '\0';
	}
}